

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

bool __thiscall MemoryManager::setByteNoCache(MemoryManager *this,uint32_t addr,uint8_t val)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint8_t in_DL;
  uint in_ESI;
  MemoryManager *in_RDI;
  uint32_t k;
  uint32_t j;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  bVar1 = isAddrExist((MemoryManager *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                      ,(uint32_t)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    uVar2 = getFirstEntryId(in_RDI,in_ESI);
    uVar3 = getSecondEntryId(in_RDI,in_ESI);
    uVar4 = getPageOffset(in_RDI,in_ESI);
    in_RDI->memory[uVar2][uVar3][uVar4] = in_DL;
  }
  else {
    dbgprintf("Byte write to invalid addr 0x%x!\n",(ulong)in_ESI);
  }
  return bVar1;
}

Assistant:

bool MemoryManager::setByteNoCache(uint32_t addr, uint8_t val) {
  if (!this->isAddrExist(addr)) {
    dbgprintf("Byte write to invalid addr 0x%x!\n", addr);
    return false;
  }

  uint32_t i = this->getFirstEntryId(addr);
  uint32_t j = this->getSecondEntryId(addr);
  uint32_t k = this->getPageOffset(addr);
  this->memory[i][j][k] = val;
  return true;
}